

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractsingleroleserialiser.cpp
# Opt level: O0

void __thiscall
AbstractSingleRoleSerialiser::AbstractSingleRoleSerialiser
          (AbstractSingleRoleSerialiser *this,QAbstractItemModel *model,QObject *parent)

{
  AbstractStringSerialiserPrivate *d;
  QObject *parent_local;
  QAbstractItemModel *model_local;
  AbstractSingleRoleSerialiser *this_local;
  
  *(undefined ***)&(this->super_AbstractStringSerialiser).super_AbstractModelSerialiser =
       &PTR_metaObject_001d2738;
  d = (AbstractStringSerialiserPrivate *)operator_new(0x38);
  AbstractSingleRoleSerialiserPrivate::AbstractSingleRoleSerialiserPrivate
            ((AbstractSingleRoleSerialiserPrivate *)d,this);
  AbstractStringSerialiser::AbstractStringSerialiser(&this->super_AbstractStringSerialiser,d,parent)
  ;
  *(undefined ***)&(this->super_AbstractStringSerialiser).super_AbstractModelSerialiser =
       &PTR_metaObject_001d2738;
  setRoleToSave(this,0);
  AbstractModelSerialiser::setModel((AbstractModelSerialiser *)this,model);
  return;
}

Assistant:

AbstractSingleRoleSerialiser::AbstractSingleRoleSerialiser(QAbstractItemModel *model, QObject *parent)
    : AbstractStringSerialiser(*new AbstractSingleRoleSerialiserPrivate(this), parent)
{
    AbstractSingleRoleSerialiser::setRoleToSave(Qt::DisplayRole);
    setModel(model);
}